

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
google::
dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
::serialize<ValueSerializer,_IO_FILE>
          (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
           *this,FILE *param_2)

{
  bool bVar1;
  undefined7 extraout_var;
  ulong uVar2;
  size_t sVar3;
  undefined7 extraout_var_00;
  undefined7 uVar4;
  byte bVar5;
  long lVar6;
  int bit;
  long lVar7;
  ulong uVar8;
  byte local_4e;
  ValueSerializer local_4d;
  uint local_4c;
  long local_48;
  Hasher *local_40;
  string *local_38;
  
  dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar1 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                    ((_IO_FILE *)param_2,0x13578642,4);
  if (((bVar1) &&
      (bVar1 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                         ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x90),8), bVar1)) &&
     (bVar1 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                        ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x88),8), bVar1)) {
    uVar2 = CONCAT71(extraout_var,*(long *)(this + 0x90) == 0);
    if (*(long *)(this + 0x90) != 0) {
      local_38 = (string *)(this + 0x60);
      local_40 = (Hasher *)(this + 0x30);
      lVar6 = 0;
      uVar8 = 0;
      do {
        local_4c = (uint)uVar2;
        local_4e = 0;
        lVar7 = 0;
        bVar5 = 0;
        local_48 = lVar6;
        do {
          if ((uVar8 + lVar7 < *(ulong *)(this + 0x90)) &&
             (bVar1 = Hasher::operator()(local_40,local_38,
                                         (string *)(*(long *)(this + 0xa8) + lVar6)), !bVar1)) {
            bVar5 = bVar5 | (byte)(1 << ((byte)lVar7 & 0x1f));
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 0x20;
        } while (lVar7 != 8);
        local_4e = bVar5;
        sVar3 = fwrite(&local_4e,1,1,param_2);
        bVar5 = local_4e;
        if (sVar3 != 1) {
LAB_009800db:
          uVar2 = (ulong)local_4c;
          break;
        }
        lVar7 = 0;
        uVar4 = 0;
        lVar6 = local_48;
        do {
          if (((bVar5 >> ((uint)lVar7 & 0x1f) & 1) != 0) &&
             (bVar1 = ValueSerializer::operator()
                                (&local_4d,(FILE *)param_2,
                                 (string *)(*(long *)(this + 0xa8) + lVar6)),
             uVar4 = extraout_var_00, !bVar1)) goto LAB_009800db;
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 0x20;
        } while (lVar7 != 8);
        uVar8 = uVar8 + 8;
        lVar6 = local_48 + 0x100;
        uVar2 = CONCAT71(uVar4,uVar8 >= *(ulong *)(this + 0x90));
      } while (uVar8 < *(ulong *)(this + 0x90));
    }
  }
  else {
    uVar2 = 0;
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }